

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O0

char * glu::getGLSLVersionName(GLSLVersion version)

{
  char **ppcVar1;
  GLSLVersion version_local;
  
  ppcVar1 = de::getSizedArrayElement<14,14,char_const*>(&getGLSLVersionName::s_names,version);
  return *ppcVar1;
}

Assistant:

const char* getGLSLVersionName (GLSLVersion version)
{
	static const char* s_names[] =
	{
		"GLSL ES 1.0",
		"GLSL ES 3.0",
		"GLSL ES 3.1",
		"GLSL ES 3.2",
		"GLSL 1.3",
		"GLSL 1.4",
		"GLSL 1.5",
		"GLSL 3.3",
		"GLSL 4.0",
		"GLSL 4.1",
		"GLSL 4.2",
		"GLSL 4.3",
		"GLSL 4.4",
		"GLSL 4.5",
	};

	return de::getSizedArrayElement<GLSL_VERSION_LAST>(s_names, version);
}